

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

bool __thiscall
CLIntercept::appendBuildOptions(CLIntercept *this,char *append,char *options,char **newOptions)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  ulong __n;
  
  sVar2 = strlen(append);
  pcVar1 = *newOptions;
  if (pcVar1 != (char *)0x0) {
    options = pcVar1;
  }
  if (options == (char *)0x0) {
    __dest = (char *)operator_new__(sVar2 + 1);
    memset(__dest,0,sVar2 + 1);
  }
  else {
    sVar3 = strlen(options);
    __n = sVar2 + sVar3 + 2;
    __dest = (char *)operator_new__(__n);
    memset(__dest,0,__n);
    strcat(__dest,options);
    sVar2 = strlen(__dest);
    (__dest + sVar2)[0] = ' ';
    (__dest + sVar2)[1] = '\0';
  }
  strcat(__dest,append);
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  *newOptions = __dest;
  return true;
}

Assistant:

bool CLIntercept::appendBuildOptions(
    const char* append,
    const char* options,
    char*& newOptions ) const
{
    bool    modified = false;

    size_t  newSize = strlen(append) + 1;    // for the null terminator

    const char* oldOptions = newOptions ? newOptions : options;
    if( oldOptions )
    {
        newSize += strlen(oldOptions) + 1;  // for a space
    }

    char* newNewOptions = new char[ newSize ];
    if( newNewOptions )
    {
        memset( newNewOptions, 0, newSize );

        if( oldOptions )
        {
            CLI_STRCAT( newNewOptions, newSize, oldOptions );
            CLI_STRCAT( newNewOptions, newSize, " " );
        }
        CLI_STRCAT( newNewOptions, newSize, append );

        delete [] newOptions;
        newOptions = newNewOptions;

        modified = true;
    }

    return modified;
}